

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

int Abc_TtHieRetrieveOrInsert(Abc_TtHieMan_t *p,int level,word *pTruth,word *pResult)

{
  Vec_Int_t *pVVar1;
  Vec_Mem_t *pVVar2;
  uint uVar3;
  uint *puVar4;
  word **ppwVar5;
  word *pwVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar17;
  byte local_60;
  ulong uVar16;
  
  if (p == (Abc_TtHieMan_t *)0x0) {
    return -1;
  }
  uVar10 = (ulong)(uint)level;
  if ((level < 0) && (uVar11 = level + p->nLastLevel + 1, uVar10 = (ulong)uVar11, (int)uVar11 < 0))
  {
    return -1;
  }
  iVar12 = (int)uVar10;
  if (p->nLastLevel < iVar12) {
    return -1;
  }
  puVar4 = (uint *)Vec_MemHashLookup(p->vTtMem[uVar10],pTruth);
  uVar11 = *puVar4;
  if (uVar11 == 0xffffffff) {
    pVVar2 = p->vTtMem[uVar10];
    pVVar1 = pVVar2->vTable;
    if (pVVar1->nSize < pVVar2->nEntries) {
      uVar13 = (ulong)(pVVar1->nSize * 2 - 1);
      while( true ) {
        do {
          uVar11 = (uint)uVar13;
          uVar14 = uVar11 + 1;
          uVar16 = (ulong)uVar14;
          uVar17 = uVar13 & 1;
          uVar13 = uVar16;
        } while (uVar17 != 0);
        if (uVar14 < 9) break;
        iVar8 = 5;
        while (uVar14 % (iVar8 - 2U) != 0) {
          uVar3 = iVar8 * iVar8;
          iVar8 = iVar8 + 2;
          if (uVar14 < uVar3) goto LAB_00505e98;
        }
      }
LAB_00505e98:
      if (pVVar1->nCap < (int)uVar14) {
        if (pVVar1->pArray == (int *)0x0) {
          piVar7 = (int *)malloc((long)(int)uVar14 << 2);
        }
        else {
          piVar7 = (int *)realloc(pVVar1->pArray,(long)(int)uVar14 << 2);
        }
        pVVar1->pArray = piVar7;
        if (piVar7 == (int *)0x0) {
LAB_0050632d:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar1->nCap = uVar14;
      }
      if (uVar11 < 0x7fffffff) {
        memset(pVVar1->pArray,0xff,uVar16 << 2);
      }
      pVVar1->nSize = uVar14;
      pVVar2->vNexts->nSize = 0;
      iVar8 = pVVar2->nEntries;
      if (iVar8 < 1) {
        iVar15 = 0;
      }
      else {
        pwVar6 = *pVVar2->ppPages;
        if (pwVar6 == (word *)0x0) goto LAB_005063a9;
        uVar11 = 1;
        do {
          piVar7 = Vec_MemHashLookup(pVVar2,pwVar6 + (long)pVVar2->nEntrySize *
                                                     (long)(int)(uVar11 - 1 & pVVar2->PageMask));
          if (*piVar7 != -1) {
            __assert_fail("*pSpot == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                          ,0x16f,"void Vec_MemHashResize(Vec_Mem_t *)");
          }
          pVVar1 = pVVar2->vNexts;
          *piVar7 = pVVar1->nSize;
          Vec_IntPush(pVVar1,-1);
          iVar8 = pVVar2->nEntries;
          if (iVar8 <= (int)uVar11) break;
          pwVar6 = pVVar2->ppPages[uVar11 >> ((byte)pVVar2->LogPageSze & 0x1f)];
          uVar11 = uVar11 + 1;
        } while (pwVar6 != (word *)0x0);
        iVar15 = pVVar2->vNexts->nSize;
      }
      if (iVar8 != iVar15) {
LAB_005063a9:
        __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                      ,0x173,"void Vec_MemHashResize(Vec_Mem_t *)");
      }
    }
    puVar4 = (uint *)Vec_MemHashLookup(pVVar2,pTruth);
    uVar11 = *puVar4;
    if (uVar11 == 0xffffffff) {
      pVVar1 = pVVar2->vNexts;
      *puVar4 = pVVar1->nSize;
      Vec_IntPush(pVVar1,-1);
      uVar11 = pVVar2->nEntries;
      if ((int)uVar11 < 0) {
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                      ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
      }
      iVar8 = pVVar2->iPage;
      local_60 = (byte)pVVar2->LogPageSze;
      uVar14 = uVar11 >> (local_60 & 0x1f);
      if (iVar8 < (int)uVar14) {
        iVar15 = pVVar2->nPageAlloc;
        if (iVar15 <= (int)uVar14) {
          iVar9 = uVar14 + 0x20;
          if (iVar15 != 0) {
            iVar9 = iVar15 * 2;
          }
          pVVar2->nPageAlloc = iVar9;
          if (pVVar2->ppPages == (word **)0x0) {
            ppwVar5 = (word **)malloc((long)iVar9 * 8);
          }
          else {
            ppwVar5 = (word **)realloc(pVVar2->ppPages,(long)iVar9 * 8);
            local_60 = (byte)pVVar2->LogPageSze;
            iVar8 = pVVar2->iPage;
          }
          pVVar2->ppPages = ppwVar5;
        }
        if (iVar8 < (int)uVar14) {
          iVar15 = pVVar2->nEntrySize;
          uVar13 = (long)iVar8;
          do {
            uVar17 = uVar13 + 1;
            pwVar6 = (word *)malloc((long)(iVar15 << (local_60 & 0x1f)) << 3);
            pVVar2->ppPages[uVar13 + 1] = pwVar6;
            uVar13 = uVar17;
          } while (uVar14 != uVar17);
        }
        pVVar2->iPage = uVar14;
        uVar14 = uVar11 >> (local_60 & 0x1f);
      }
      pVVar2->nEntries = uVar11 + 1;
      memmove(pVVar2->ppPages[uVar14] +
              (long)(int)(pVVar2->PageMask & uVar11) * (long)pVVar2->nEntrySize,pTruth,
              (long)pVVar2->nEntrySize << 3);
      if (pVVar2->nEntries != pVVar2->vNexts->nSize) {
        __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                      ,0x180,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
      }
      uVar11 = pVVar2->nEntries - 1;
    }
    p->vTruthId[uVar10] = uVar11;
    iVar8 = p->nLastLevel;
    if (iVar12 < iVar8) {
      return 0;
    }
  }
  else {
    iVar8 = p->nLastLevel;
  }
  if (iVar12 < iVar8) {
    if (((int)uVar11 < 0) || (p->vRepres[uVar10]->nSize <= (int)uVar11)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar11 = p->vRepres[uVar10]->pArray[uVar11];
  }
  if (iVar12 != 0) {
    uVar13 = 0;
    do {
      pVVar1 = p->vRepres[uVar13];
      uVar14 = p->vTruthId[uVar13];
      uVar3 = pVVar1->nSize;
      if ((int)uVar14 < (int)uVar3) {
        uVar17 = (ulong)uVar3;
      }
      else {
        uVar17 = (long)(int)uVar14 + 1;
        iVar8 = pVVar1->nCap;
        if ((int)uVar14 < iVar8 * 2) {
          if (iVar8 <= (int)uVar14) {
            if (pVVar1->pArray == (int *)0x0) {
              piVar7 = (int *)malloc((long)iVar8 << 3);
            }
            else {
              piVar7 = (int *)realloc(pVVar1->pArray,(long)iVar8 << 3);
            }
            pVVar1->pArray = piVar7;
            iVar8 = iVar8 * 2;
LAB_005061d0:
            if (piVar7 == (int *)0x0) goto LAB_0050632d;
            pVVar1->nCap = iVar8;
            uVar3 = pVVar1->nSize;
          }
        }
        else if (iVar8 <= (int)uVar14) {
          if (pVVar1->pArray == (int *)0x0) {
            piVar7 = (int *)malloc(uVar17 * 4);
          }
          else {
            piVar7 = (int *)realloc(pVVar1->pArray,uVar17 * 4);
          }
          pVVar1->pArray = piVar7;
          iVar8 = (int)uVar17;
          goto LAB_005061d0;
        }
        if ((int)uVar3 <= (int)uVar14) {
          memset(pVVar1->pArray + (int)uVar3,0,(ulong)(uVar14 - uVar3) * 4 + 4);
        }
        pVVar1->nSize = (int)uVar17;
      }
      if (((int)uVar14 < 0) || ((int)uVar17 <= (int)uVar14)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar1->pArray[uVar14] = uVar11;
      uVar13 = uVar13 + 1;
    } while (uVar10 != uVar13);
    iVar8 = p->nLastLevel;
  }
  if (((int)uVar11 < 0) || (pVVar2 = p->vTtMem[iVar8], pVVar2->nEntries <= (int)uVar11)) {
    __assert_fail("i >= 0 && i < p->nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                  ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
  }
  iVar15 = (uVar11 & pVVar2->PageMask) * pVVar2->nEntrySize;
  pwVar6 = pVVar2->ppPages[uVar11 >> ((byte)pVVar2->LogPageSze & 0x1f)];
  uVar11 = p->nWords;
  uVar10 = (ulong)uVar11;
  if (iVar12 < iVar8) {
    if (0 < (int)uVar11) {
      uVar13 = 0;
      do {
        pResult[uVar13] = pwVar6[(long)iVar15 + uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
      return 1;
    }
    return 1;
  }
  if (0 < (int)uVar11) {
    uVar13 = 0;
    do {
      if (pTruth[uVar13] != pwVar6[(long)iVar15 + uVar13]) {
        __assert_fail("Abc_TtEqual(pTruth, pRepTruth, p->nWords)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                      ,0x51b,"int Abc_TtHieRetrieveOrInsert(Abc_TtHieMan_t *, int, word *, word *)")
        ;
      }
      uVar13 = uVar13 + 1;
    } while (uVar10 != uVar13);
    if (pTruth != pResult) {
      uVar13 = 0;
      do {
        pResult[uVar13] = pwVar6[(long)iVar15 + uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
      return 0;
    }
  }
  return 0;
}

Assistant:

int Abc_TtHieRetrieveOrInsert(Abc_TtHieMan_t * p, int level, word * pTruth, word * pResult)
{
    int i, iSpot, truthId;
    word * pRepTruth;
    if (!p) return -1;
    if (level < 0) level += p->nLastLevel + 1;
    if (level < 0 || level > p->nLastLevel) return -1;
    iSpot = *Vec_MemHashLookup(p->vTtMem[level], pTruth);
    if (iSpot == -1) {
        p->vTruthId[level] = Vec_MemHashInsert(p->vTtMem[level], pTruth);
        if (level < p->nLastLevel) return 0;
        iSpot = p->vTruthId[level];
    }
    // return the class representative
    if (level < p->nLastLevel)
        truthId = Vec_IntEntry(p->vRepres[level], iSpot);
    else
        truthId = iSpot;
    for (i = 0; i < level; i++)
        Vec_IntSetEntry(p->vRepres[i], p->vTruthId[i], truthId);

    pRepTruth = Vec_MemReadEntry(p->vTtMem[p->nLastLevel], truthId);
    if (level < p->nLastLevel) {
        Abc_TtCopy(pResult, pRepTruth, p->nWords, 0);
        return 1;
    }
    assert(Abc_TtEqual(pTruth, pRepTruth, p->nWords));
    if (pTruth != pResult)
        Abc_TtCopy(pResult, pRepTruth, p->nWords, 0);
    return 0;
}